

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

char * ImGui::TableGetColumnName(int column_n)

{
  short sVar1;
  ImGuiTable *table;
  char *pcVar2;
  uint uVar3;
  ImGuiTableColumn *pIVar4;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    return (char *)0x0;
  }
  if (column_n < 0) {
    pcVar2 = TableGetColumnName(table,table->CurrentColumn);
    return pcVar2;
  }
  pcVar2 = "";
  if ((table->IsLayoutLocked != false) || (column_n < table->DeclColumnsCount)) {
    if ((column_n < 0) ||
       (pIVar4 = (table->Columns).Data + column_n, (table->Columns).DataEnd <= pIVar4)) {
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                    ,0x20d,
                    "const T &ImSpan<ImGuiTableColumn>::operator[](int) const [T = ImGuiTableColumn]"
                   );
    }
    sVar1 = pIVar4->NameOffset;
    uVar3 = (uint)sVar1;
    if (uVar3 != 0xffffffff) {
      if ((sVar1 < 0) || ((table->ColumnsNames).Buf.Size <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                      ,0x659,"const T &ImVector<char>::operator[](int) const [T = char]");
      }
      pcVar2 = (table->ColumnsNames).Buf.Data + uVar3;
    }
  }
  return pcVar2;
}

Assistant:

const char* ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}